

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall SceneRender::renderPositionBuffer(SceneRender *this,Uniforms *_uniforms)

{
  _Rb_tree_header *p_Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Camera *_camera;
  Shader *pSVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  mapped_type *ppSVar28;
  float *pfVar29;
  _Base_ptr p_Var30;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4 local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  size_type local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  string local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Tracker *local_40;
  Fbo *local_38;
  
  if ((this->positionFbo).m_allocated == true) {
    local_38 = &this->positionFbo;
    vera::Fbo::bind(local_38,(int)_uniforms,in_RDX,in_ECX);
    if (this->m_depth_test == true) {
      glEnable(0xb71);
    }
    _camera = (_uniforms->super_Scene).activeCamera;
    if (((_camera->super_Node).bChange != false) || ((this->m_origin).bChange == true)) {
      vera::setCamera(_camera);
      vera::applyMatrix(&(this->m_origin).m_transformMatrix);
    }
    if (-1 < this->m_floor_subd_target) {
      local_148.value[0]._0_8_ = local_148.value + 1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"position","");
      ppSVar28 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                 ::operator[](&(this->m_floor).gBuffersShaders,(key_type *)&local_148);
      pSVar13 = *ppSVar28;
      if ((col_type *)local_148.value[0]._0_8_ != local_148.value + 1) {
        operator_delete((void *)local_148.value[0]._0_8_,
                        CONCAT44(local_148.value[1].field_1,local_148.value[1].field_0) + 1);
      }
      if (pSVar13 != (Shader *)0x0) {
        if ((_uniforms->tracker).m_running == true) {
          local_148.value[0]._0_8_ = local_148.value + 1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"render:scenePosition:floor","");
          Tracker::begin(&_uniforms->tracker,(string *)&local_148);
          if ((col_type *)local_148.value[0]._0_8_ != local_148.value + 1) {
            operator_delete((void *)local_148.value[0]._0_8_,
                            CONCAT44(local_148.value[1].field_1,local_148.value[1].field_0) + 1);
          }
        }
        vera::Shader::use(pSVar13);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar13,0);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"u_modelViewProjectionMatrix","");
        vera::getProjectionViewWorldMatrix();
        fVar35 = SUB84(local_c8._M_dataplus._M_p,0);
        fVar36 = (float)((ulong)local_c8._M_dataplus._M_p >> 0x20);
        fVar39 = (float)local_c8._M_string_length;
        fVar40 = (float)(local_c8._M_string_length >> 0x20);
        local_e8 = local_c8._M_string_length;
        uStack_e0 = 0;
        fVar41 = (float)local_c8.field_2._8_8_;
        fVar42 = (float)((ulong)local_c8.field_2._8_8_ >> 0x20);
        local_f8 = local_c8.field_2._8_8_;
        uStack_f0 = 0;
        fVar31 = (float)local_a8;
        fVar32 = (float)((ulong)local_a8 >> 0x20);
        local_d8 = local_a8;
        uStack_d0 = 0;
        fVar43 = (float)local_a0;
        fVar44 = (float)((ulong)local_a0 >> 0x20);
        local_58 = local_a0;
        uStack_50 = 0;
        fVar33 = (float)local_98;
        fVar34 = (float)((ulong)local_98 >> 0x20);
        fVar45 = (float)local_90;
        fVar46 = (float)((ulong)local_90 >> 0x20);
        local_68 = local_90;
        uStack_60 = 0;
        fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
        fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
        fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
        fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
        fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
        fVar17 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
        local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p;
        uStack_100 = 0;
        fVar37 = (float)local_c8.field_2._M_allocated_capacity;
        fVar38 = (float)((ulong)local_c8.field_2._0_8_ >> 0x20);
        fVar18 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
        fVar19 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
        fVar20 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
        local_148.value[0].field_2.z =
             fVar15 * fVar45 + fVar4 * fVar43 + fVar3 * fVar41 + fVar2 * fVar39;
        local_148.value[0].field_3.w =
             fVar15 * fVar46 + fVar4 * fVar44 + fVar3 * fVar42 + fVar2 * fVar40;
        fVar21 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
        fVar22 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
        fVar23 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
        fVar24 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
        fVar25 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
        fVar26 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
        fVar27 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
        local_148.value[0].field_1.y =
             fVar34 * fVar15 + fVar32 * fVar4 + fVar38 * fVar3 + fVar36 * fVar2;
        local_148.value[0].field_0.x =
             fVar33 * fVar15 + fVar31 * fVar4 + fVar37 * fVar3 + fVar35 * fVar2;
        local_148.value[1].field_0.x =
             fVar33 * fVar19 + fVar31 * fVar18 + fVar37 * fVar17 + fVar35 * fVar16;
        local_148.value[1].field_1.y =
             fVar34 * fVar19 + fVar32 * fVar18 + fVar38 * fVar17 + fVar36 * fVar16;
        local_148.value[1].field_2.z =
             fVar19 * fVar45 + fVar18 * fVar43 + fVar17 * fVar41 + fVar16 * fVar39;
        local_148.value[1].field_3.w =
             fVar19 * fVar46 + fVar18 * fVar44 + fVar17 * fVar42 + fVar16 * fVar40;
        local_148.value[2].field_0.x =
             fVar33 * fVar23 + fVar31 * fVar22 + fVar37 * fVar21 + fVar35 * fVar20;
        local_148.value[2].field_1.y =
             fVar34 * fVar23 + fVar32 * fVar22 + fVar38 * fVar21 + fVar36 * fVar20;
        local_148.value[2].field_2.z =
             fVar23 * fVar45 + fVar22 * fVar43 + fVar21 * fVar41 + fVar20 * fVar39;
        local_148.value[2].field_3.w =
             fVar23 * fVar46 + fVar22 * fVar44 + fVar21 * fVar42 + fVar20 * fVar40;
        local_148.value[3].field_0.x =
             fVar33 * fVar27 + fVar31 * fVar26 + fVar37 * fVar25 + fVar35 * fVar24;
        local_148.value[3].field_1.y =
             fVar34 * fVar27 + fVar32 * fVar26 + fVar38 * fVar25 + fVar36 * fVar24;
        local_148.value[3].field_2.z =
             fVar27 * fVar45 + fVar26 * fVar43 + fVar25 * fVar41 + fVar24 * fVar39;
        local_148.value[3].field_3.w =
             fVar27 * fVar46 + fVar26 * fVar44 + fVar25 * fVar42 + fVar24 * fVar40;
        vera::Shader::setUniform(pSVar13,&local_88,&local_148,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        local_148.value[0]._0_8_ = local_148.value + 1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_model","");
        vera::Shader::setUniform
                  (pSVar13,(string *)&local_148,
                   (this->m_origin).m_position.field_0.x +
                   (this->m_floor).super_Node.m_position.field_0.x,
                   (this->m_origin).m_position.field_1.y +
                   (this->m_floor).super_Node.m_position.field_1.y,
                   (this->m_origin).m_position.field_2.z +
                   (this->m_floor).super_Node.m_position.field_2.z);
        if ((col_type *)local_148.value[0]._0_8_ != local_148.value + 1) {
          operator_delete((void *)local_148.value[0]._0_8_,
                          CONCAT44(local_148.value[1].field_1,local_148.value[1].field_0) + 1);
        }
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"u_modelMatrix","");
        local_108._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
        local_108._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
        local_e8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
        local_e8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
        uStack_e0 = 0;
        uVar5 = (this->m_origin).m_transformMatrix.value[1].field_0;
        uVar9 = (this->m_origin).m_transformMatrix.value[1].field_1;
        local_f8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
        local_f8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
        uStack_f0 = 0;
        local_d8._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
        local_d8._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
        uStack_d0 = 0;
        local_58._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
        local_58._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
        uStack_50 = 0;
        uVar6 = (this->m_origin).m_transformMatrix.value[3].field_0;
        uVar10 = (this->m_origin).m_transformMatrix.value[3].field_1;
        local_68._0_4_ = (this->m_origin).m_transformMatrix.value[3].field_2;
        local_68._4_4_ = (this->m_origin).m_transformMatrix.value[3].field_3;
        uStack_60 = 0;
        fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
        fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
        fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
        fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
        fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
        fVar17 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
        uStack_100 = 0;
        fVar18 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
        fVar19 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
        fVar20 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
        local_148.value[0].field_2.z =
             fVar15 * (float)(undefined4)local_68 +
             fVar4 * (float)(undefined4)local_58 +
             fVar3 * (float)(undefined4)local_f8 + fVar2 * (float)(undefined4)local_e8;
        local_148.value[0].field_3.w =
             fVar15 * (float)local_68._4_4_ +
             fVar4 * (float)local_58._4_4_ +
             fVar3 * (float)local_f8._4_4_ + fVar2 * (float)local_e8._4_4_;
        fVar21 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
        fVar22 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
        fVar23 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
        fVar24 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
        fVar25 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
        fVar26 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
        fVar27 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
        local_148.value[0].field_1.y =
             (float)uVar10 * fVar15 +
             (float)local_d8._4_4_ * fVar4 + (float)uVar9 * fVar3 + (float)local_108._4_4_ * fVar2;
        local_148.value[0].field_0.x =
             (float)uVar6 * fVar15 +
             (float)(undefined4)local_d8 * fVar4 +
             (float)uVar5 * fVar3 + (float)local_108._0_4_ * fVar2;
        local_148.value[1].field_0.x =
             (float)uVar6 * fVar19 +
             (float)(undefined4)local_d8 * fVar18 +
             (float)uVar5 * fVar17 + (float)local_108._0_4_ * fVar16;
        local_148.value[1].field_1.y =
             (float)uVar10 * fVar19 +
             (float)local_d8._4_4_ * fVar18 +
             (float)uVar9 * fVar17 + (float)local_108._4_4_ * fVar16;
        local_148.value[1].field_2.z =
             fVar19 * (float)(undefined4)local_68 +
             fVar18 * (float)(undefined4)local_58 +
             fVar17 * (float)(undefined4)local_f8 + fVar16 * (float)(undefined4)local_e8;
        local_148.value[1].field_3.w =
             fVar19 * (float)local_68._4_4_ +
             fVar18 * (float)local_58._4_4_ +
             fVar17 * (float)local_f8._4_4_ + fVar16 * (float)local_e8._4_4_;
        local_148.value[2].field_0.x =
             (float)uVar6 * fVar23 +
             (float)(undefined4)local_d8 * fVar22 +
             (float)uVar5 * fVar21 + (float)local_108._0_4_ * fVar20;
        local_148.value[2].field_1.y =
             (float)uVar10 * fVar23 +
             (float)local_d8._4_4_ * fVar22 +
             (float)uVar9 * fVar21 + (float)local_108._4_4_ * fVar20;
        local_148.value[2].field_2.z =
             fVar23 * (float)(undefined4)local_68 +
             fVar22 * (float)(undefined4)local_58 +
             fVar21 * (float)(undefined4)local_f8 + fVar20 * (float)(undefined4)local_e8;
        local_148.value[2].field_3.w =
             fVar23 * (float)local_68._4_4_ +
             fVar22 * (float)local_58._4_4_ +
             fVar21 * (float)local_f8._4_4_ + fVar20 * (float)local_e8._4_4_;
        local_148.value[3].field_0.x =
             (float)uVar6 * fVar27 +
             (float)(undefined4)local_d8 * fVar26 +
             (float)uVar5 * fVar25 + (float)local_108._0_4_ * fVar24;
        local_148.value[3].field_1.y =
             (float)uVar10 * fVar27 +
             (float)local_d8._4_4_ * fVar26 +
             (float)uVar9 * fVar25 + (float)local_108._4_4_ * fVar24;
        local_148.value[3].field_2.z =
             fVar27 * (float)(undefined4)local_68 +
             fVar26 * (float)(undefined4)local_58 +
             fVar25 * (float)(undefined4)local_f8 + fVar24 * (float)(undefined4)local_e8;
        local_148.value[3].field_3.w =
             fVar27 * (float)local_68._4_4_ +
             fVar26 * (float)local_58._4_4_ +
             fVar25 * (float)local_f8._4_4_ + fVar24 * (float)local_e8._4_4_;
        vera::Shader::setUniform(pSVar13,&local_c8,&local_148,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        vera::Model::render(&this->m_floor,pSVar13);
        if ((_uniforms->tracker).m_running == true) {
          local_148.value[0]._0_8_ = local_148.value + 1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"render:scenePosition:floor","");
          Tracker::end(&_uniforms->tracker,(string *)&local_148);
          if ((col_type *)local_148.value[0]._0_8_ != local_148.value + 1) {
            operator_delete((void *)local_148.value[0]._0_8_,
                            CONCAT44(local_148.value[1].field_1,local_148.value[1].field_0) + 1);
          }
        }
      }
    }
    vera::cullingMode(this->m_culling);
    p_Var30 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var30 != p_Var1) {
      local_40 = &_uniforms->tracker;
      do {
        lVar14 = *(long *)(p_Var30 + 2);
        local_148.value[0]._0_8_ = local_148.value + 1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"position","");
        ppSVar28 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                                 *)(lVar14 + 600),(key_type *)&local_148);
        pSVar13 = *ppSVar28;
        if ((col_type *)local_148.value[0]._0_8_ != local_148.value + 1) {
          operator_delete((void *)local_148.value[0]._0_8_,
                          CONCAT44(local_148.value[1].field_1,local_148.value[1].field_0) + 1);
        }
        if (pSVar13 != (Shader *)0x0) {
          if ((_uniforms->tracker).m_running == true) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_148,"render:scenePosition:",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(long *)(p_Var30 + 2) + 0x2b0));
            Tracker::begin(local_40,(string *)&local_148);
            if ((col_type *)local_148.value[0]._0_8_ != local_148.value + 1) {
              operator_delete((void *)local_148.value[0]._0_8_,
                              CONCAT44(local_148.value[1].field_1,local_148.value[1].field_0) + 1);
            }
          }
          vera::Shader::use(pSVar13);
          (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar13,0);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"u_modelViewProjectionMatrix","");
          vera::getProjectionViewWorldMatrix();
          pfVar29 = (float *)(**(code **)(**(long **)(p_Var30 + 2) + 0x100))();
          fVar35 = SUB84(local_c8._M_dataplus._M_p,0);
          fVar36 = (float)((ulong)local_c8._M_dataplus._M_p >> 0x20);
          fVar39 = (float)local_c8._M_string_length;
          fVar40 = (float)(local_c8._M_string_length >> 0x20);
          local_e8 = local_c8._M_string_length;
          uStack_e0 = 0;
          fVar41 = (float)local_c8.field_2._8_8_;
          fVar42 = (float)((ulong)local_c8.field_2._8_8_ >> 0x20);
          local_f8 = local_c8.field_2._8_8_;
          uStack_f0 = 0;
          fVar31 = (float)local_a8;
          fVar32 = (float)((ulong)local_a8 >> 0x20);
          local_d8 = local_a8;
          uStack_d0 = 0;
          fVar45 = (float)local_a0;
          fVar46 = (float)((ulong)local_a0 >> 0x20);
          local_58 = local_a0;
          uStack_50 = 0;
          fVar33 = (float)local_98;
          fVar34 = (float)((ulong)local_98 >> 0x20);
          fVar43 = (float)local_90;
          fVar44 = (float)((ulong)local_90 >> 0x20);
          local_68 = local_90;
          uStack_60 = 0;
          fVar15 = *pfVar29;
          fVar16 = pfVar29[1];
          fVar17 = pfVar29[2];
          fVar18 = pfVar29[3];
          fVar19 = pfVar29[4];
          fVar20 = pfVar29[5];
          local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p;
          uStack_100 = 0;
          fVar37 = (float)local_c8.field_2._M_allocated_capacity;
          fVar38 = (float)((ulong)local_c8.field_2._0_8_ >> 0x20);
          fVar21 = pfVar29[6];
          fVar22 = pfVar29[7];
          fVar23 = pfVar29[8];
          local_148.value[0].field_2.z =
               fVar18 * fVar43 + fVar17 * fVar45 + fVar16 * fVar41 + fVar15 * fVar39;
          local_148.value[0].field_3.w =
               fVar18 * fVar44 + fVar17 * fVar46 + fVar16 * fVar42 + fVar15 * fVar40;
          fVar24 = pfVar29[9];
          fVar25 = pfVar29[10];
          fVar26 = pfVar29[0xb];
          fVar27 = pfVar29[0xc];
          fVar2 = pfVar29[0xd];
          fVar3 = pfVar29[0xe];
          fVar4 = pfVar29[0xf];
          local_148.value[0].field_1.y =
               fVar34 * fVar18 + fVar32 * fVar17 + fVar38 * fVar16 + fVar36 * fVar15;
          local_148.value[0].field_0.x =
               fVar33 * fVar18 + fVar31 * fVar17 + fVar37 * fVar16 + fVar35 * fVar15;
          local_148.value[1].field_0.x =
               fVar33 * fVar22 + fVar31 * fVar21 + fVar37 * fVar20 + fVar35 * fVar19;
          local_148.value[1].field_1.y =
               fVar34 * fVar22 + fVar32 * fVar21 + fVar38 * fVar20 + fVar36 * fVar19;
          local_148.value[1].field_2.z =
               fVar22 * fVar43 + fVar21 * fVar45 + fVar20 * fVar41 + fVar19 * fVar39;
          local_148.value[1].field_3.w =
               fVar22 * fVar44 + fVar21 * fVar46 + fVar20 * fVar42 + fVar19 * fVar40;
          local_148.value[2].field_0.x =
               fVar33 * fVar26 + fVar31 * fVar25 + fVar37 * fVar24 + fVar35 * fVar23;
          local_148.value[2].field_1.y =
               fVar34 * fVar26 + fVar32 * fVar25 + fVar38 * fVar24 + fVar36 * fVar23;
          local_148.value[2].field_2.z =
               fVar26 * fVar43 + fVar25 * fVar45 + fVar24 * fVar41 + fVar23 * fVar39;
          local_148.value[2].field_3.w =
               fVar26 * fVar44 + fVar25 * fVar46 + fVar24 * fVar42 + fVar23 * fVar40;
          local_148.value[3].field_0.x =
               fVar33 * fVar4 + fVar31 * fVar3 + fVar37 * fVar2 + fVar35 * fVar27;
          local_148.value[3].field_1.y =
               fVar34 * fVar4 + fVar32 * fVar3 + fVar38 * fVar2 + fVar36 * fVar27;
          local_148.value[3].field_2.z =
               fVar4 * fVar43 + fVar3 * fVar45 + fVar2 * fVar41 + fVar27 * fVar39;
          local_148.value[3].field_3.w =
               fVar4 * fVar44 + fVar3 * fVar46 + fVar2 * fVar42 + fVar27 * fVar40;
          vera::Shader::setUniform(pSVar13,&local_88,&local_148,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          local_148.value[0]._0_8_ = local_148.value + 1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"u_model","");
          pfVar29 = (float *)(**(code **)(**(long **)(p_Var30 + 2) + 0x98))();
          vera::Shader::setUniform
                    (pSVar13,(string *)&local_148,(this->m_origin).m_position.field_0.x + *pfVar29,
                     (this->m_origin).m_position.field_1.y + pfVar29[1],
                     (this->m_origin).m_position.field_2.z + pfVar29[2]);
          if ((col_type *)local_148.value[0]._0_8_ != local_148.value + 1) {
            operator_delete((void *)local_148.value[0]._0_8_,
                            CONCAT44(local_148.value[1].field_1,local_148.value[1].field_0) + 1);
          }
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"u_modelMatrix","");
          pfVar29 = (float *)(**(code **)(**(long **)(p_Var30 + 2) + 0x100))();
          local_108._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
          local_108._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
          local_e8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
          local_e8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
          uStack_e0 = 0;
          uVar7 = (this->m_origin).m_transformMatrix.value[1].field_0;
          uVar11 = (this->m_origin).m_transformMatrix.value[1].field_1;
          local_f8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
          local_f8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
          uStack_f0 = 0;
          local_d8._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
          local_d8._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
          uStack_d0 = 0;
          local_58._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
          local_58._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
          uStack_50 = 0;
          uVar8 = (this->m_origin).m_transformMatrix.value[3].field_0;
          uVar12 = (this->m_origin).m_transformMatrix.value[3].field_1;
          local_68._0_4_ = (this->m_origin).m_transformMatrix.value[3].field_2;
          local_68._4_4_ = (this->m_origin).m_transformMatrix.value[3].field_3;
          uStack_60 = 0;
          fVar15 = *pfVar29;
          fVar16 = pfVar29[1];
          fVar17 = pfVar29[2];
          fVar18 = pfVar29[3];
          fVar19 = pfVar29[4];
          fVar20 = pfVar29[5];
          uStack_100 = 0;
          fVar21 = pfVar29[6];
          fVar22 = pfVar29[7];
          fVar23 = pfVar29[8];
          local_148.value[0].field_2.z =
               fVar18 * (float)(undefined4)local_68 +
               fVar17 * (float)(undefined4)local_58 +
               fVar16 * (float)(undefined4)local_f8 + fVar15 * (float)(undefined4)local_e8;
          local_148.value[0].field_3.w =
               fVar18 * (float)local_68._4_4_ +
               fVar17 * (float)local_58._4_4_ +
               fVar16 * (float)local_f8._4_4_ + fVar15 * (float)local_e8._4_4_;
          fVar24 = pfVar29[9];
          fVar25 = pfVar29[10];
          fVar26 = pfVar29[0xb];
          fVar27 = pfVar29[0xc];
          fVar2 = pfVar29[0xd];
          fVar3 = pfVar29[0xe];
          fVar4 = pfVar29[0xf];
          local_148.value[0].field_1.y =
               (float)uVar12 * fVar18 +
               (float)local_d8._4_4_ * fVar17 +
               (float)uVar11 * fVar16 + (float)local_108._4_4_ * fVar15;
          local_148.value[0].field_0.x =
               (float)uVar8 * fVar18 +
               (float)(undefined4)local_d8 * fVar17 +
               (float)uVar7 * fVar16 + (float)local_108._0_4_ * fVar15;
          local_148.value[1].field_0.x =
               (float)uVar8 * fVar22 +
               (float)(undefined4)local_d8 * fVar21 +
               (float)uVar7 * fVar20 + (float)local_108._0_4_ * fVar19;
          local_148.value[1].field_1.y =
               (float)uVar12 * fVar22 +
               (float)local_d8._4_4_ * fVar21 +
               (float)uVar11 * fVar20 + (float)local_108._4_4_ * fVar19;
          local_148.value[1].field_2.z =
               fVar22 * (float)(undefined4)local_68 +
               fVar21 * (float)(undefined4)local_58 +
               fVar20 * (float)(undefined4)local_f8 + fVar19 * (float)(undefined4)local_e8;
          local_148.value[1].field_3.w =
               fVar22 * (float)local_68._4_4_ +
               fVar21 * (float)local_58._4_4_ +
               fVar20 * (float)local_f8._4_4_ + fVar19 * (float)local_e8._4_4_;
          local_148.value[2].field_0.x =
               (float)uVar8 * fVar26 +
               (float)(undefined4)local_d8 * fVar25 +
               (float)uVar7 * fVar24 + (float)local_108._0_4_ * fVar23;
          local_148.value[2].field_1.y =
               (float)uVar12 * fVar26 +
               (float)local_d8._4_4_ * fVar25 +
               (float)uVar11 * fVar24 + (float)local_108._4_4_ * fVar23;
          local_148.value[2].field_2.z =
               fVar26 * (float)(undefined4)local_68 +
               fVar25 * (float)(undefined4)local_58 +
               fVar24 * (float)(undefined4)local_f8 + fVar23 * (float)(undefined4)local_e8;
          local_148.value[2].field_3.w =
               fVar26 * (float)local_68._4_4_ +
               fVar25 * (float)local_58._4_4_ +
               fVar24 * (float)local_f8._4_4_ + fVar23 * (float)local_e8._4_4_;
          local_148.value[3].field_0.x =
               (float)uVar8 * fVar4 +
               (float)(undefined4)local_d8 * fVar3 +
               (float)uVar7 * fVar2 + (float)local_108._0_4_ * fVar27;
          local_148.value[3].field_1.y =
               (float)uVar12 * fVar4 +
               (float)local_d8._4_4_ * fVar3 +
               (float)uVar11 * fVar2 + (float)local_108._4_4_ * fVar27;
          local_148.value[3].field_2.z =
               fVar4 * (float)(undefined4)local_68 +
               fVar3 * (float)(undefined4)local_58 +
               fVar2 * (float)(undefined4)local_f8 + fVar27 * (float)(undefined4)local_e8;
          local_148.value[3].field_3.w =
               fVar4 * (float)local_68._4_4_ +
               fVar3 * (float)local_58._4_4_ +
               fVar2 * (float)local_f8._4_4_ + fVar27 * (float)local_e8._4_4_;
          vera::Shader::setUniform(pSVar13,&local_c8,&local_148,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          vera::Model::render(*(Model **)(p_Var30 + 2),pSVar13);
          if ((_uniforms->tracker).m_running == true) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_148,"render:scenePosition:",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(long *)(p_Var30 + 2) + 0x2b0));
            Tracker::end(local_40,(string *)&local_148);
            if ((col_type *)local_148.value[0]._0_8_ != local_148.value + 1) {
              operator_delete((void *)local_148.value[0]._0_8_,
                              CONCAT44(local_148.value[1].field_1,local_148.value[1].field_0) + 1);
            }
          }
        }
        p_Var30 = (_Base_ptr)std::_Rb_tree_increment(p_Var30);
      } while ((_Rb_tree_header *)p_Var30 != p_Var1);
    }
    if (this->m_depth_test != false) {
      glDisable(0xb71);
    }
    if (this->m_culling != CULL_NONE) {
      glDisable(0xb44);
    }
    vera::Fbo::unbind(local_38);
  }
  return;
}

Assistant:

void SceneRender::renderPositionBuffer(Uniforms& _uniforms) {
    if (!positionFbo.isAllocated())
        return;

    positionFbo.bind();

    // Begining of DEPTH for 3D 
    if (m_depth_test)
        glEnable(GL_DEPTH_TEST);

    if (_uniforms.activeCamera->bChange || m_origin.bChange) {
        vera::setCamera( _uniforms.activeCamera );
        vera::applyMatrix( m_origin.getTransformMatrix() );
    }

    vera::Shader* positionShader = nullptr;
    if (m_floor_subd_target >= 0) {
        positionShader = m_floor.getBufferShader("position");
        if (positionShader != nullptr) {
            TRACK_BEGIN("render:scenePosition:floor")
            positionShader->use();
            _uniforms.feedTo( positionShader, false );
            positionShader->setUniform("u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() *  m_floor.getTransformMatrix() );
            positionShader->setUniform("u_model", m_origin.getPosition() + m_floor.getPosition() );
            positionShader->setUniform("u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
            m_floor.render(positionShader);
            TRACK_END("render:scenePosition:floor")
        } 
    }

    vera::cullingMode(m_culling);

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        positionShader = it->second->getBufferShader("position");
        if (positionShader != nullptr) {
            TRACK_BEGIN("render:scenePosition:" + it->second->getName() )

            // bind the shader
            positionShader->use();

            // Update Uniforms and textures variables to the shader
            _uniforms.feedTo( positionShader, false );

            // Pass special uniforms
            positionShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() *  it->second->getTransformMatrix() );
            positionShader->setUniform( "u_model", m_origin.getPosition() + it->second->getPosition() );
            positionShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
            it->second->render(positionShader);

            TRACK_END("render:scenePosition:" + it->second->getName() )
        }
    }

    if (m_depth_test)
        glDisable(GL_DEPTH_TEST);

    if (m_culling != 0)
        glDisable(GL_CULL_FACE);

    positionFbo.unbind();
}